

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternTest.cpp
# Opt level: O1

bool __thiscall
PatternTest::TestOnePattern
          (PatternTest *this,char **test_strings,size_t nb_test_strings,uint32_t pattern)

{
  uint8_t *str;
  bool bVar1;
  size_t len;
  bool bVar2;
  ulong uVar3;
  uint32_t flags;
  uint8_t val [64];
  uint32_t local_80;
  uint32_t local_7c;
  uint8_t local_78 [72];
  
  if (nb_test_strings == 0) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    uVar3 = 1;
    local_7c = pattern;
    do {
      local_80 = 0;
      str = (uint8_t *)test_strings[uVar3 - 1];
      len = strlen((char *)str);
      bVar1 = NamePattern::Preprocess(str,len,local_78,&local_80);
      if ((local_80 & local_7c) == 0) {
        bVar2 = false;
      }
      if (!bVar1) {
        bVar2 = false;
      }
    } while ((uVar3 < nb_test_strings) && (uVar3 = uVar3 + 1, bVar2));
  }
  return bVar2;
}

Assistant:

bool PatternTest::TestOnePattern(char const  ** test_strings,
    size_t nb_test_strings, uint32_t pattern)
{
    bool ret = true;
    uint8_t val[64];
    uint32_t flags;
    size_t len;

    for (size_t i = 0; ret && i < nb_test_strings; i++)
    {
        flags = 0;
        len = strlen(test_strings[i]);
        if (!NamePattern::Preprocess((uint8_t *)test_strings[i], len, val, &flags))
        {
            ret = false;
        }
        else if ((flags&pattern) == 0)
        {
            ret = false;
        }
    }

    return ret;
}